

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O1

bool __thiscall
TimesAll<0,0,0>::propagate_xy<0,0>
          (TimesAll<0,0,0> *this,IntView<0> u,IntView<0> v,int64_t v_min,int64_t v_max,int64_t z_min
          ,int64_t z_max)

{
  bool bVar1;
  char cVar2;
  undefined4 uVar3;
  uint uVar4;
  int iVar5;
  Clause *pCVar6;
  _func_int **pp_Var7;
  IntVar *pIVar8;
  Clause *pCVar9;
  IntVar *pIVar10;
  undefined8 uVar11;
  Clause *c;
  
  pIVar8 = v.var;
  pIVar10 = u.var;
  if (z_max == 0 && z_min == 0) {
    if (v_min < 1 && -1 < v_max) {
      return true;
    }
    if (so.lazy) {
      c = (Clause *)malloc(0x1c);
      *(uint *)c = *(uint *)c & 0xfc | 0x502;
      vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),&c);
      pCVar6 = c;
      iVar5 = (*(pIVar8->super_Var).super_Branching._vptr_Branching[8])(pIVar8);
      if (*(uint *)pCVar6 < 0x200) goto LAB_001b003f;
      *(int *)(pCVar6 + 1) = iVar5;
      iVar5 = (*(pIVar8->super_Var).super_Branching._vptr_Branching[9])(pIVar8);
      if (*(uint *)pCVar6 < 0x300) goto LAB_001b003f;
      pCVar6[1].data[0].x = iVar5;
      uVar3 = (**(code **)(**(long **)(this + 0x38) + 0x40))();
      if (*(uint *)pCVar6 < 0x400) goto LAB_001b003f;
      *(undefined4 *)(pCVar6 + 2) = uVar3;
      iVar5 = (**(code **)(**(long **)(this + 0x38) + 0x48))();
      if (*(uint *)pCVar6 < 0x500) goto LAB_001b003f;
      pCVar6[2].data[0].x = iVar5;
    }
    else {
      pCVar6 = (Clause *)0x0;
    }
    if ((pIVar10->min).v < 0) {
      pCVar9 = (Clause *)0x0;
      if (so.lazy != false) {
        pCVar9 = pCVar6;
      }
      iVar5 = (*(pIVar10->super_Var).super_Branching._vptr_Branching[0xe])(pIVar10,0,pCVar9,1);
      if ((char)iVar5 == '\0') {
        return false;
      }
    }
    if ((pIVar10->max).v < 1) {
      return true;
    }
    if (so.lazy == false) {
      pCVar6 = (Clause *)0x0;
    }
    pp_Var7 = (pIVar10->super_Var).super_Branching._vptr_Branching;
    uVar11 = 0;
LAB_001affc2:
    iVar5 = (*pp_Var7[0xf])(pIVar10,uVar11,pCVar6,1);
    cVar2 = (char)iVar5;
LAB_001b0026:
    if (cVar2 == '\0') {
      return false;
    }
  }
  else {
    if (z_min < 1) {
      if (-1 < z_max) {
        return true;
      }
      if (v_min == 0) {
        if (!so.lazy) goto LAB_001afffc;
        pCVar6 = Reason_new(3);
        uVar4 = (**(code **)(**(long **)(this + 0x38) + 0x48))();
LAB_001afe71:
        if (*(uint *)pCVar6 < 0x200) {
LAB_001b003f:
          abort();
        }
        *(uint *)(pCVar6 + 1) = uVar4;
        iVar5 = (*(pIVar8->super_Var).super_Branching._vptr_Branching[8])(pIVar8);
        if (*(uint *)pCVar6 < 0x300) goto LAB_001b003f;
        pCVar6[1].data[0].x = iVar5;
        goto LAB_001affff;
      }
      if (v_max == 0) {
        if (!so.lazy) goto LAB_001aff9a;
        pCVar6 = Reason_new(3);
        uVar4 = (**(code **)(**(long **)(this + 0x38) + 0x48))();
LAB_001aff6a:
        if (*(uint *)pCVar6 < 0x200) goto LAB_001b003f;
        *(uint *)(pCVar6 + 1) = uVar4;
        iVar5 = (*(pIVar8->super_Var).super_Branching._vptr_Branching[9])(pIVar8);
        if (*(uint *)pCVar6 < 0x300) goto LAB_001b003f;
        pCVar6[1].data[0].x = iVar5;
        goto LAB_001aff9d;
      }
    }
    else {
      if (v_min == 0) {
        if (so.lazy) {
          c = (Clause *)malloc(0x14);
          *(uint *)c = *(uint *)c & 0xfc | 0x302;
          vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),&c);
          pCVar6 = c;
          uVar4 = (**(code **)(**(long **)(this + 0x38) + 0x40))();
          goto LAB_001afe71;
        }
LAB_001afffc:
        pCVar6 = (Clause *)0x0;
LAB_001affff:
        if (0 < (pIVar8->min).v) {
          return true;
        }
        if (so.lazy == false) {
          pCVar6 = (Clause *)0x0;
        }
        iVar5 = (*(pIVar8->super_Var).super_Branching._vptr_Branching[0xe])(pIVar8,1,pCVar6,1);
        cVar2 = (char)iVar5;
        goto LAB_001b0026;
      }
      if (v_max == 0) {
        if (so.lazy) {
          c = (Clause *)malloc(0x14);
          *(uint *)c = *(uint *)c & 0xfc | 0x302;
          vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),&c);
          pCVar6 = c;
          uVar4 = (**(code **)(**(long **)(this + 0x38) + 0x40))();
          goto LAB_001aff6a;
        }
LAB_001aff9a:
        pCVar6 = (Clause *)0x0;
LAB_001aff9d:
        if ((pIVar8->max).v < 0) {
          return true;
        }
        if (so.lazy == false) {
          pCVar6 = (Clause *)0x0;
        }
        pp_Var7 = (pIVar8->super_Var).super_Branching._vptr_Branching;
        uVar11 = 0xffffffffffffffff;
        pIVar10 = pIVar8;
        goto LAB_001affc2;
      }
    }
    bVar1 = propagate_xy_min<0,0>(this,u,v,v_min,v_max,z_min,z_max);
    if ((!bVar1) || (bVar1 = propagate_xy_max<0,0>(this,u,v,v_min,v_max,z_min,z_max), !bVar1)) {
      return false;
    }
  }
  return true;
}

Assistant:

bool propagate_xy(IntView<U> u, IntView<V> v, const int64_t v_min, const int64_t v_max,
										const int64_t z_min, const int64_t z_max) {
		if (z_min == 0 && z_max == 0) {
			// The product z equals to 0. Then x must equal to 0 too if y cannot be 0.
			if (v_min > 0 || v_max < 0) {
				// TODO Better explanation
				Clause* reason = nullptr;
				if (so.lazy) {
					reason = Reason_new(5);
					(*reason)[1] = v.getMinLit();
					(*reason)[2] = v.getMaxLit();
					(*reason)[3] = z.getMinLit();
					(*reason)[4] = z.getMaxLit();
				}
				setDom(u, setMin, 0, reason);
				setDom(u, setMax, 0, reason);
			}
		} else if (z_min > 0) {
			if (v_min == 0) {
				// TODO Better explanation
				Clause* reason = nullptr;
				if (so.lazy) {
					reason = Reason_new(3);
					(*reason)[1] = z.getMinLit();
					(*reason)[2] = v.getMinLit();
				}
				setDom(v, setMin, 1, reason);
			} else if (v_max == 0) {
				// TODO Better explanation
				Clause* reason = nullptr;
				if (so.lazy) {
					reason = Reason_new(3);
					(*reason)[1] = z.getMinLit();
					(*reason)[2] = v.getMaxLit();
				}
				setDom(v, setMax, -1, reason);
			} else {
				if (!propagate_xy_min(u, v, v_min, v_max, z_min, z_max)) {
					return false;
				}
				if (!propagate_xy_max(u, v, v_min, v_max, z_min, z_max)) {
					return false;
				}
			}
		} else if (z_max < 0) {
			if (v_min == 0) {
				// TODO Better explanation
				Clause* reason = nullptr;
				if (so.lazy) {
					reason = Reason_new(3);
					(*reason)[1] = z.getMaxLit();
					(*reason)[2] = v.getMinLit();
				}
				setDom(v, setMin, 1, reason);
			} else if (v_max == 0) {
				// TODO Better explanation
				Clause* reason = nullptr;
				if (so.lazy) {
					reason = Reason_new(3);
					(*reason)[1] = z.getMaxLit();
					(*reason)[2] = v.getMaxLit();
				}
				setDom(v, setMax, -1, reason);
			} else {
				if (!propagate_xy_min(u, v, v_min, v_max, z_min, z_max)) {
					return false;
				}
				if (!propagate_xy_max(u, v, v_min, v_max, z_min, z_max)) {
					return false;
				}
			}
		}
		return true;
	}